

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcode.c
# Opt level: O2

int sizei(Instruction *i)

{
  byte bVar1;
  
  bVar1 = (i->i).code - 2;
  if (bVar1 < 0xf) {
    return *(int *)(&DAT_0014699c + (ulong)bVar1 * 4);
  }
  return 1;
}

Assistant:

int sizei (const Instruction *i) {
  switch((Opcode)i->i.code) {
    case ISet: case ISpan: return CHARSETINSTSIZE;
    case ITestSet: return CHARSETINSTSIZE + 1;
    case ITestChar: case ITestAny: case IChoice: case IJmp: case ICall:
    case IOpenCall: case ICommit: case IPartialCommit: case IBackCommit:
      return 2;
    default: return 1;
  }
}